

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O0

uint __thiscall
ON_SubDSectorType::GetAllEigenvalues
          (ON_SubDSectorType *this,double *eigenvalues,size_t eigenvalues_capacity)

{
  bool bVar1;
  ON_SubDVertexTag vertex_tag_00;
  uint uVar2;
  double dVar3;
  double dVar4;
  uint local_84;
  double local_78;
  double e2 [2];
  uint k;
  uint D;
  double d;
  double c;
  double b;
  double a;
  uint N;
  ON_SubDVertexTag vertex_tag;
  ulong uStack_30;
  uint R;
  size_t i;
  size_t eigenvalues_capacity_local;
  double *eigenvalues_local;
  ON_SubDSectorType *this_local;
  
  if (eigenvalues_capacity == 0) {
    eigenvalues_capacity_local = 0;
  }
  else {
    if (eigenvalues == (double *)0x0) {
      ON_SubDIncrementErrorCount();
      return 0;
    }
    for (uStack_30 = 0; eigenvalues_capacity_local = (size_t)eigenvalues,
        uStack_30 < eigenvalues_capacity; uStack_30 = uStack_30 + 1) {
      eigenvalues[uStack_30] = -1.23432101234321e+308;
    }
  }
  bVar1 = IsValid(this);
  if (bVar1) {
    this_local._4_4_ = PointRingCount(this);
    if ((this_local._4_4_ == 0) ||
       ((eigenvalues_capacity_local != 0 && (eigenvalues_capacity < this_local._4_4_)))) {
      ON_SubDIncrementErrorCount();
      this_local._4_4_ = 0;
    }
    else {
      vertex_tag_00 = VertexTag(this);
      uVar2 = EdgeCount(this);
      bVar1 = ON_SubD::IsValidSectorEdgeCount(vertex_tag_00,uVar2);
      if (bVar1) {
        if (vertex_tag_00 == Smooth) {
          if (eigenvalues_capacity_local == 0) {
            return this_local._4_4_;
          }
          *(undefined8 *)eigenvalues_capacity_local = 0x3ff0000000000000;
          dVar3 = (double)(uVar2 * 3 - 7);
          if (uVar2 < 6) {
            local_84 = uVar2 * 5 * uVar2 + 0x31 + uVar2 * -0x1e;
          }
          else {
            local_84 = (uVar2 * 5 + -0x1e) * uVar2 + 0x31;
          }
          dVar4 = sqrt((double)local_84);
          _k = 0.125;
          for (e2[1]._4_4_ = uVar2; e2[1]._4_4_ != 0 && (e2[1]._4_4_ & 1) == 0;
              e2[1]._4_4_ = e2[1]._4_4_ >> 1) {
            _k = _k * 0.5;
          }
          *(double *)(eigenvalues_capacity_local + 8) = (_k / (double)e2[1]._4_4_) * (dVar3 + dVar4)
          ;
          *(double *)(eigenvalues_capacity_local + 0x10) =
               (_k / (double)e2[1]._4_4_) * (dVar3 - dVar4);
          for (e2[1]._0_4_ = 1; e2[1]._0_4_ < uVar2; e2[1]._0_4_ = e2[1]._0_4_ + 1) {
            GetQuadSubdivisionMatrix_eigenvalue_pair(e2[1]._0_4_,uVar2,&local_78);
            *(double *)(eigenvalues_capacity_local + (ulong)(e2[1]._0_4_ * 2 + 1) * 8) = local_78;
            *(double *)(eigenvalues_capacity_local + (ulong)(e2[1]._0_4_ * 2 + 2) * 8) = e2[0];
          }
          ON_SortDoubleArrayDecreasing
                    ((double *)(eigenvalues_capacity_local + 8),(ulong)(this_local._4_4_ - 1));
        }
        else if ((vertex_tag_00 == Crease) && (uVar2 < 0x15)) {
          if (eigenvalues_capacity_local == 0) {
            return this_local._4_4_;
          }
          uVar2 = GetQuadCreaseEigenvalues
                            (uVar2,this_local._4_4_,(double *)eigenvalues_capacity_local);
          if (((this_local._4_4_ != uVar2) || (*(double *)eigenvalues_capacity_local != 1.0)) ||
             (NAN(*(double *)eigenvalues_capacity_local))) {
            ON_SubDIncrementErrorCount();
            return 0;
          }
        }
        if (eigenvalues_capacity_local == 0) {
          this_local._4_4_ = 0;
        }
        else if ((*(double *)eigenvalues_capacity_local != 1.0) ||
                (NAN(*(double *)eigenvalues_capacity_local))) {
          ON_SubDIncrementErrorCount();
          this_local._4_4_ = 0;
        }
      }
      else {
        ON_SubDIncrementErrorCount();
        this_local._4_4_ = 0;
      }
    }
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDSectorType::GetAllEigenvalues(
  double* eigenvalues,
  size_t eigenvalues_capacity
  )
{
  if ( 0 == eigenvalues_capacity)
    eigenvalues = nullptr;
  else
  {
    if (nullptr == eigenvalues)
      return ON_SUBD_RETURN_ERROR(0);

    for (size_t i = 0; i < eigenvalues_capacity; i++)
      eigenvalues[i] = ON_UNSET_VALUE;
  }

  if (false == IsValid())
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int R = PointRingCount();
  if ( 0  == R || (nullptr != eigenvalues && eigenvalues_capacity < R))
    return ON_SUBD_RETURN_ERROR(0);

  const ON_SubDVertexTag vertex_tag = VertexTag();
  const unsigned int N = EdgeCount();

  if (false == ON_SubD::IsValidSectorEdgeCount(vertex_tag, N))
    return ON_SUBD_RETURN_ERROR(0);

  if (ON_SubDVertexTag::Smooth == vertex_tag)
  {
    if (nullptr == eigenvalues)
    {
      // caller is asking if eigenvalues are available
      return R;
    }
    eigenvalues[0] = 1.0;

    double a = (3 * N - 7);
    double b = (N >= 6) ? ((5 * N - 30)*N + 49) : ((5 * N*N + 49) - 30 * N);
    double c = sqrt(b);
    double d = 0.125;
    unsigned int D = N;
    while (D > 0 && 0 == (D % 2))
    {
      D /= 2;
      d *= 0.5;
    }
    d /= ((double)D);

    eigenvalues[1] = d*(a + c);
    eigenvalues[2] = d*(a - c);

    for (unsigned int k = 1; k < N; k++)
    {
      double e2[2];
      GetQuadSubdivisionMatrix_eigenvalue_pair(k, N, e2);
      eigenvalues[2 * k + 1] = e2[0];
      eigenvalues[2 * k + 2] = e2[1];
    }

    // return sorted in decreasing order
    ON_SortDoubleArrayDecreasing(eigenvalues + 1, R - 1);
  }
  else if (ON_SubDVertexTag::Crease == vertex_tag)
  {
    if (N <= 20)
    {
      if (nullptr == eigenvalues)
      {
        // caller is asking if eigenvalues are available
        return R;
      }
      if (R != GetQuadCreaseEigenvalues(N, R, eigenvalues) || !(1.0 == eigenvalues[0]))
        return ON_SUBD_RETURN_ERROR(0);
    }
  }

  if (nullptr == eigenvalues)
  {
    // caller is asking if eigenvalues are available
    return 0; // not an error
  }

  if (!(1.0 == eigenvalues[0]))
    return ON_SUBD_RETURN_ERROR(0);

  return R;
}